

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choicfmt.cpp
# Opt level: O1

int32_t icu_63::ChoiceFormat::matchStringUntilLimitPart
                  (MessagePattern *pattern,int32_t partIndex,int32_t limitPartIndex,
                  UnicodeString *source,int32_t sourceOffset)

{
  ushort uVar1;
  Part *pPVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  char16_t *srcChars;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int srcStart;
  int32_t iVar9;
  int srcLength;
  int length;
  long lVar10;
  
  uVar7 = (ulong)partIndex;
  iVar5 = (uint)pattern->parts[uVar7].length + pattern->parts[uVar7].index;
  lVar10 = uVar7 * 0x10 + 0x18;
  iVar6 = 0;
  lVar8 = ~uVar7 + (long)limitPartIndex;
  do {
    pPVar2 = pattern->parts;
    if ((lVar8 == 0) || (bVar3 = true, *(int *)((long)pPVar2 + lVar10 + -8) == 2)) {
      length = *(int *)((long)pPVar2 + lVar10 + -4) - iVar5;
      if (length != 0) {
        uVar1 = (pattern->msg).fUnion.fStackFields.fLengthAndFlags;
        if ((uVar1 & 1) == 0) {
          if ((short)uVar1 < 0) {
            iVar9 = (pattern->msg).fUnion.fFields.fLength;
          }
          else {
            iVar9 = (int)(short)uVar1 >> 5;
          }
          srcStart = iVar5;
          if (iVar9 < iVar5) {
            srcStart = iVar9;
          }
          if (iVar5 < 0) {
            srcStart = 0;
          }
          srcLength = iVar9 - srcStart;
          if (length <= iVar9 - srcStart) {
            srcLength = length;
          }
          if (length < 0) {
            srcLength = 0;
          }
          srcChars = (pattern->msg).fUnion.fStackFields.fBuffer;
          if ((uVar1 & 2) == 0) {
            srcChars = (pattern->msg).fUnion.fFields.fArray;
          }
          bVar4 = icu_63::UnicodeString::doCompare
                            (source,sourceOffset,length,srcChars,srcStart,srcLength);
        }
        else {
          bVar4 = ~*(byte *)&source->fUnion & 1;
        }
        if (bVar4 != 0) {
          bVar3 = false;
          partIndex = -1;
          goto LAB_002cdb9b;
        }
      }
      iVar6 = iVar6 + length;
      if (lVar8 == 0) {
        bVar3 = false;
        partIndex = iVar6;
      }
      else {
        iVar5 = (uint)*(ushort *)((long)&pPVar2->type + lVar10) +
                *(int *)((long)pPVar2 + lVar10 + -4);
        bVar3 = true;
      }
    }
LAB_002cdb9b:
    lVar10 = lVar10 + 0x10;
    lVar8 = lVar8 + -1;
    if (!bVar3) {
      return partIndex;
    }
  } while( true );
}

Assistant:

int32_t
ChoiceFormat::matchStringUntilLimitPart(
        const MessagePattern &pattern, int32_t partIndex, int32_t limitPartIndex,
        const UnicodeString &source, int32_t sourceOffset) {
    int32_t matchingSourceLength = 0;
    const UnicodeString &msgString = pattern.getPatternString();
    int32_t prevIndex = pattern.getPart(partIndex).getLimit();
    for (;;) {
        const MessagePattern::Part &part = pattern.getPart(++partIndex);
        if (partIndex == limitPartIndex || part.getType() == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            int32_t index = part.getIndex();
            int32_t length = index - prevIndex;
            if (length != 0 && 0 != source.compare(sourceOffset, length, msgString, prevIndex, length)) {
                return -1;  // mismatch
            }
            matchingSourceLength += length;
            if (partIndex == limitPartIndex) {
                return matchingSourceLength;
            }
            prevIndex = part.getLimit();  // SKIP_SYNTAX
        }
    }
}